

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::startAubCapture
          (CLIntercept *this,char *functionName,uint64_t enqueueCounter,cl_kernel kernel,
          cl_uint workDim,size_t *gws,size_t *lws,cl_command_queue command_queue)

{
  cl_icd_dispatch *pcVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Services *this_00;
  SConfig *fileName_00;
  long in_RCX;
  ulong in_RDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  uint in_R8D;
  ulong *in_R9;
  double __x;
  ulong *in_stack_00000008;
  cl_command_queue in_stack_00000010;
  ostringstream ss;
  string *kernelName;
  string fileName;
  char charBuf [256];
  bool skip;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffbd8;
  lock_guard<std::mutex> *in_stack_fffffffffffffbe0;
  _cl_kernel *in_stack_fffffffffffffbf8;
  ostream *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  _cl_kernel *in_stack_fffffffffffffc20;
  CLIntercept *this_01;
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  ostringstream local_348 [376];
  string local_1d0 [32];
  string *local_1b0;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  _cl_kernel local_158 [287];
  bool local_39;
  ulong *local_30;
  uint local_24;
  long local_20;
  ulong local_18;
  char *local_10;
  
  if ((in_RDI->m_AubCaptureStarted & 1U) == 0) {
    local_30 = in_R9;
    local_24 = in_R8D;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_39 = false;
    if (local_20 != 0) {
      if (in_RDI->m_AubCaptureKernelEnqueueSkipCounter <
          (in_RDI->m_Config).AubCaptureNumKernelEnqueuesSkip) {
        local_39 = true;
        in_RDI->m_AubCaptureKernelEnqueueSkipCounter =
             in_RDI->m_AubCaptureKernelEnqueueSkipCounter + 1;
      }
      else {
        local_39 = (in_RDI->m_Config).AubCaptureNumKernelEnqueuesCapture <=
                   in_RDI->m_AubCaptureKernelEnqueueCaptureCounter;
        in_RDI->m_AubCaptureKernelEnqueueCaptureCounter =
             in_RDI->m_AubCaptureKernelEnqueueCaptureCounter + 1;
      }
    }
    if ((local_39 == false) && ((in_RDI->m_AubCaptureStarted & 1U) == 0)) {
      pcVar1 = dispatch(in_RDI);
      (*pcVar1->clFinish)(in_stack_00000010);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"",&local_179);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      OS(in_RDI);
      this_01 = (CLIntercept *)sc_DumpDirectoryName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,(char *)this_01,&local_1a1);
      ::OS::Services_Common::GetDumpDirectoryName
                ((Services_Common *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::__cxx11::string::operator+=(local_178,"/");
      std::__cxx11::string::operator+=(local_178,"AubCapture");
      if (((in_RDI->m_Config).AubCaptureIndividualEnqueues & 1U) == 0) {
        if (((in_RDI->m_Config).AubCaptureMinEnqueue != 0) ||
           ((in_RDI->m_Config).AubCaptureMaxEnqueue != 0xffffffff)) {
          std::__cxx11::string::operator+=(local_178,"_Enqueue_");
          in_stack_fffffffffffffbf8 = local_158;
          snprintf((char *)in_stack_fffffffffffffbf8,0x100,"%08u",
                   (ulong)(in_RDI->m_Config).AubCaptureMinEnqueue);
          std::__cxx11::string::operator+=(local_178,(char *)in_stack_fffffffffffffbf8);
          std::__cxx11::string::operator+=(local_178,"_to_");
          snprintf((char *)local_158,0x100,"%08u",(ulong)(in_RDI->m_Config).AubCaptureMaxEnqueue);
          std::__cxx11::string::operator+=(local_178,(char *)local_158);
        }
      }
      else {
        std::__cxx11::string::operator+=(local_178,"_Enqueue_");
        in_stack_fffffffffffffc20 = local_158;
        snprintf((char *)in_stack_fffffffffffffc20,0x100,"%08u",local_18 & 0xffffffff);
        std::__cxx11::string::operator+=(local_178,(char *)in_stack_fffffffffffffc20);
        std::__cxx11::string::operator+=(local_178,"_");
        if (local_20 == 0) {
          std::__cxx11::string::operator+=(local_178,local_10);
        }
        else {
          getShortKernelName_abi_cxx11_(this_01,in_stack_fffffffffffffc20);
          local_1b0 = local_1d0;
          std::__cxx11::string::operator+=(local_178,"kernel_");
          std::__cxx11::string::operator+=(local_178,local_1b0);
          std::__cxx11::ostringstream::ostringstream(local_348);
          std::operator<<((ostream *)local_348,"_G_");
          if (local_30 == (ulong *)0x0) {
            std::operator<<((ostream *)local_348,"NULL");
          }
          else {
            if (local_24 != 0) {
              std::ostream::operator<<(local_348,*local_30);
            }
            if (1 < local_24) {
              poVar2 = std::operator<<((ostream *)local_348,"x");
              std::ostream::operator<<(poVar2,local_30[1]);
            }
            if (2 < local_24) {
              poVar2 = std::operator<<((ostream *)local_348,"x");
              std::ostream::operator<<(poVar2,local_30[2]);
            }
          }
          std::operator<<((ostream *)local_348,"_L_");
          if (in_stack_00000008 == (ulong *)0x0) {
            std::operator<<((ostream *)local_348,"NULL");
          }
          else {
            if (local_24 != 0) {
              std::ostream::operator<<(local_348,*in_stack_00000008);
            }
            if (1 < local_24) {
              poVar2 = std::operator<<((ostream *)local_348,"x");
              std::ostream::operator<<(poVar2,in_stack_00000008[1]);
            }
            if (2 < local_24) {
              in_stack_fffffffffffffc00 = std::operator<<((ostream *)local_348,"x");
              std::ostream::operator<<(in_stack_fffffffffffffc00,in_stack_00000008[2]);
            }
          }
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator+=(local_178,local_368);
          std::__cxx11::string::~string(local_368);
          std::__cxx11::ostringstream::~ostringstream(local_348);
          std::__cxx11::string::~string(local_1d0);
        }
      }
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)OS(in_RDI);
      ::OS::Services_Common::MakeDumpDirectories
                ((Services_Common *)in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
      std::__cxx11::string::operator+=(local_178,".aub");
      this_00 = OS(in_RDI);
      fileName_00 = config(in_RDI);
      ::OS::Services::StartAubCapture(this_00,(string *)fileName_00,0x2141ce);
      std::operator+((char *)this_01,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc20);
      __x = (double)std::operator+(__lhs,(char *)this_00);
      log(in_RDI,__x);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::string::~string(local_3a8);
      in_RDI->m_AubCaptureStarted = true;
      std::__cxx11::string::~string(local_178);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2142b5);
  }
  return;
}

Assistant:

void CLIntercept::startAubCapture(
    const char* functionName,
    const uint64_t enqueueCounter,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gws,
    const size_t* lws,
    cl_command_queue command_queue )
{
    if( m_AubCaptureStarted == false )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        // For kernels, perform aub capture skip checks.  We'll skip aubcapture if:
        // - the current skip counter is less than the specified skip counter, or
        // - the current capture counter is greater than or equal to the specified capture counter.

        bool    skip = false;
        if( kernel != NULL )
        {
            if( m_AubCaptureKernelEnqueueSkipCounter < m_Config.AubCaptureNumKernelEnqueuesSkip )
            {
                //logf( "Skipping kernel aub capture: current skip counter is %u, requested skip counter is %u.\n",
                //    m_AubCaptureKernelEnqueueSkipCounter,
                //    m_Config.AubCaptureNumKernelEnqueuesSkip );

                skip = true;
                ++m_AubCaptureKernelEnqueueSkipCounter;
            }
            else
            {
                if( m_AubCaptureKernelEnqueueCaptureCounter >= m_Config.AubCaptureNumKernelEnqueuesCapture )
                {
                    //logf( "Skipping kernel aub capture: current capture counter is %u, requested capture counter is %u.\n",
                    //    m_AubCaptureKernelEnqueueCaptureCounter,
                    //    m_Config.AubCaptureNumKernelEnqueuesCapture );
                    skip = true;
                }

                ++m_AubCaptureKernelEnqueueCaptureCounter;
            }
        }

        if( skip == false &&
            m_AubCaptureStarted == false )
        {
            // Try to call clFinish() on the passed-in command queue.
            // This isn't perfect, since we'd really rather call
            // clFinish on all command queues to start with a fresh
            // capture, but it's better than nothing.
            // TODO: Is Flush() sufficient?
            dispatch().clFinish( command_queue );

            char    charBuf[ MAX_PATH ];

            std::string fileName = "";

            // Get the dump directory name.
            {
                OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
                fileName += "/";
                fileName += "AubCapture";

                if( m_Config.AubCaptureIndividualEnqueues )
                {
                    fileName += "_Enqueue_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", (cl_uint)enqueueCounter );

                    fileName += charBuf;
                    fileName += "_";

                    if( kernel )
                    {
                        const std::string& kernelName = getShortKernelName(kernel);
                        fileName += "kernel_";
                        fileName += kernelName;

                        std::ostringstream  ss;
                        ss << "_G_";
                        if( gws )
                        {
                            if( workDim >= 1 )
                            {
                                ss << gws[0];
                            }
                            if( workDim >= 2 )
                            {
                                ss << "x" << gws[1];
                            }
                            if( workDim >= 3 )
                            {
                                ss << "x" << gws[2];
                            }
                        }
                        else
                        {
                            ss << "NULL";
                        }
                        ss << "_L_";
                        if( lws )
                        {
                            if( workDim >= 1 )
                            {
                                ss << lws[0];
                            }
                            if( workDim >= 2 )
                            {
                                ss << "x" << lws[1];
                            }
                            if( workDim >= 3 )
                            {
                                ss << "x" << lws[2];
                            }
                        }
                        else
                        {
                            ss << "NULL";
                        }
                        fileName += ss.str();
                    }
                    else
                    {
                        fileName += functionName;
                    }
                }
                else if( m_Config.AubCaptureMinEnqueue != 0 ||
                         m_Config.AubCaptureMaxEnqueue != UINT_MAX )
                {
                    fileName += "_Enqueue_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", m_Config.AubCaptureMinEnqueue );

                    fileName += charBuf;
                    fileName += "_to_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", m_Config.AubCaptureMaxEnqueue );

                    fileName += charBuf;
                }
            }

            // Now make directories as appropriate.
            {
                OS().MakeDumpDirectories( fileName );
            }

#if defined(_WIN32)
            if( m_Config.AubCaptureKDC )
            {
                fileName += ".daf";
                OS().StartAubCaptureKDC(
                    fileName,
                    config().AubCaptureStartWait );
            }
            else
#endif
            {
                fileName += ".aub";
                OS().StartAubCapture(
                    fileName,
                    config().AubCaptureStartWait );
            }
            log( "AubCapture started... maybe.  File name is: " + fileName + "\n" );

            // No matter what, set the flag that aubcapture is started, so we
            // don't try again.
            m_AubCaptureStarted = true;
        }
    }
}